

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O1

void predict_iforest(double *numeric_data,int *categ_data,bool is_col_major,size_t ncols_numeric,
                    size_t ncols_categ,double *Xc,size_t *Xc_ind,size_t *Xc_indptr,double *Xr,
                    size_t *Xr_ind,size_t *Xr_indptr,size_t nrows,int nthreads,bool standardize,
                    IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *output_depths,
                    size_t *tree_num,double *per_tree_depths,TreesIndexer *indexer)

{
  double dVar1;
  pointer pSVar2;
  pointer pvVar3;
  pointer puVar4;
  pointer pvVar5;
  pointer pIVar6;
  size_t sVar7;
  ulong uVar8;
  double *pdVar9;
  ExtIsoForest *pEVar10;
  undefined8 uVar11;
  unsigned_long *puVar12;
  long lVar13;
  size_t *psVar14;
  size_t *psVar15;
  size_t row;
  size_t *psVar16;
  pointer pIVar17;
  pointer pvVar18;
  pointer pvVar19;
  undefined4 uVar20;
  long lVar21;
  double *tree_depth;
  ulong uVar22;
  double *pdVar23;
  long lVar24;
  double *pdVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dStack_f8;
  double *pdStack_f0;
  double *pdStack_e8;
  double dStack_e0;
  long lStack_d0;
  size_t sStack_c8;
  long alStack_c0 [2];
  int iStack_ac;
  size_t sStack_a8;
  int *piStack_a0;
  ulong uStack_98;
  PredictionData<double,_unsigned_long> PStack_90;
  
  if (nrows == 0) {
    return;
  }
  PStack_90.nrows = nrows;
  PStack_90.Xc_ind = Xc_ind;
  PStack_90.Xc_indptr = Xc_indptr;
  PStack_90.Xr = Xr;
  PStack_90.Xr_ind = Xr_ind;
  PStack_90.Xr_indptr = Xr_indptr;
  iStack_ac = (int)nrows;
  if ((ulong)(long)nthreads <= nrows) {
    iStack_ac = nthreads;
  }
  pdStack_e8 = (double *)ncols_numeric;
  pdStack_f0 = numeric_data;
  piStack_a0 = categ_data;
  PStack_90.numeric_data = numeric_data;
  PStack_90.categ_data = categ_data;
  PStack_90.is_col_major = is_col_major;
  PStack_90.ncols_numeric = ncols_numeric;
  PStack_90.ncols_categ = ncols_categ;
  PStack_90.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (size_t *)0x0) {
    Xc_indptr = (size_t *)output_depths;
    batched_csc_predict<double,unsigned_long>
              (&PStack_90,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
  }
  else if (model_outputs == (IsoForest *)0x0) {
    if ((((Xc_indptr == (size_t *)0x0) && (Xr_indptr == (size_t *)0x0)) &&
        (categ_data == (int *)0x0)) &&
       ((model_outputs_ext->missing_action == Fail &&
        (model_outputs_ext->has_range_penalty == false)))) {
      if (nrows == 1 || !is_col_major) {
        pdStack_e8 = (double *)(nrows * 8);
        lVar13 = 0;
        sVar7 = 0;
        do {
          dStack_f8 = 0.0;
          pvVar19 = (model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar24 = (long)(model_outputs_ext->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar19;
          if (lVar24 != 0) {
            uVar8 = (lVar24 >> 3) * -0x5555555555555555;
            lVar24 = 0;
            uVar22 = 0;
            pdVar23 = per_tree_depths;
            pdVar9 = (double *)tree_num;
            do {
              Xc_indptr = (size_t *)pdVar9;
              if (tree_num == (size_t *)0x0) {
                Xc_indptr = tree_num;
              }
              pdVar25 = (double *)(uVar8 * lVar13 + (long)pdVar23);
              if (per_tree_depths == (double *)0x0) {
                pdVar25 = (double *)0x0;
              }
              traverse_hplane_fast_rowmajor<double,unsigned_long>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar19->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl + lVar24),model_outputs_ext,
                         PStack_90.numeric_data + PStack_90.ncols_numeric * sVar7,&dStack_f8,
                         Xc_indptr,pdVar25,sVar7);
              uVar22 = uVar22 + 1;
              pvVar19 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar19 >> 3) *
                      -0x5555555555555555;
              pdVar9 = (double *)((long)pdVar9 + (long)pdStack_e8);
              pdVar23 = pdVar23 + 1;
              lVar24 = lVar24 + 0x18;
            } while (uVar22 < uVar8);
          }
          output_depths[sVar7] = dStack_f8;
          sVar7 = sVar7 + 1;
          lVar13 = lVar13 + 8;
        } while (sVar7 != nrows);
      }
      else {
        pdStack_e8 = (double *)(nrows * 8);
        lVar13 = 0;
        sVar7 = 0;
        do {
          dStack_f8 = 0.0;
          pvVar19 = (model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar24 = (long)(model_outputs_ext->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar19;
          if (lVar24 != 0) {
            uVar8 = (lVar24 >> 3) * -0x5555555555555555;
            lVar24 = 0;
            uVar22 = 0;
            pdVar23 = (double *)tree_num;
            pdVar9 = per_tree_depths;
            do {
              Xc_indptr = (size_t *)pdVar23;
              if (tree_num == (size_t *)0x0) {
                Xc_indptr = tree_num;
              }
              pdVar25 = (double *)(uVar8 * lVar13 + (long)pdVar9);
              if (per_tree_depths == (double *)0x0) {
                pdVar25 = (double *)0x0;
              }
              traverse_hplane_fast_colmajor<PredictionData<double,unsigned_long>,unsigned_long>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar19->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl + lVar24),model_outputs_ext,&PStack_90,&dStack_f8,
                         Xc_indptr,pdVar25,sVar7);
              uVar22 = uVar22 + 1;
              pvVar19 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar19 >> 3) *
                      -0x5555555555555555;
              pdVar23 = (double *)((long)pdVar23 + (long)pdStack_e8);
              pdVar9 = pdVar9 + 1;
              lVar24 = lVar24 + 0x18;
            } while (uVar22 < uVar8);
          }
          output_depths[sVar7] = dStack_f8;
          sVar7 = sVar7 + 1;
          lVar13 = lVar13 + 8;
        } while (sVar7 != nrows);
      }
    }
    else {
      sStack_c8 = nrows + (nrows == 0);
      pdStack_f0 = (double *)(nrows * 8);
      pdStack_e8 = (double *)0x0;
      sVar7 = 0;
      do {
        dStack_f8 = 0.0;
        pvVar19 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)(model_outputs_ext->hplanes).
                       super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar19;
        if (lVar13 != 0) {
          uVar8 = (lVar13 >> 3) * -0x5555555555555555;
          lVar13 = 0;
          uVar22 = 0;
          psVar15 = tree_num;
          pdVar23 = per_tree_depths;
          do {
            puVar12 = psVar15;
            if (tree_num == (size_t *)0x0) {
              puVar12 = tree_num;
            }
            pdVar9 = (double *)(uVar8 * (long)pdStack_e8 + (long)pdVar23);
            if (per_tree_depths == (double *)0x0) {
              pdVar9 = (double *)0x0;
            }
            traverse_hplane<PredictionData<double,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                      ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                       ((long)&(pvVar19->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                               _M_impl + lVar13),model_outputs_ext,&PStack_90,&dStack_f8,
                       (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                       (ImputedData<unsigned_long,_double> *)0x0,puVar12,pdVar9,sVar7);
            uVar22 = uVar22 + 1;
            pvVar19 = (model_outputs_ext->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = ((long)(model_outputs_ext->hplanes).
                           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar19 >> 3) *
                    -0x5555555555555555;
            psVar15 = (size_t *)((long)psVar15 + (long)pdStack_f0);
            pdVar23 = pdVar23 + 1;
            lVar13 = lVar13 + 0x18;
          } while (uVar22 < uVar8);
        }
        output_depths[sVar7] = dStack_f8;
        sVar7 = sVar7 + 1;
        Xc_indptr = (size_t *)(pdStack_e8 + 1);
        pdStack_e8 = (double *)Xc_indptr;
      } while (sVar7 != sStack_c8);
    }
  }
  else {
    if (model_outputs->missing_action == Fail) {
      if (model_outputs->new_cat_action == Weighted) {
        if (((Xc_indptr == (size_t *)0x0) && (Xr_indptr == (size_t *)0x0)) &&
           (categ_data == (int *)0x0 || model_outputs->cat_split_type == SingleCateg))
        goto LAB_001478e8;
      }
      else {
        Xc_indptr = (size_t *)((ulong)Xc_indptr | (ulong)Xr_indptr);
        if ((double *)Xc_indptr == (double *)0x0) {
LAB_001478e8:
          if (model_outputs->has_range_penalty == false) {
            Xc_indptr = (size_t *)((ulong)Xc_indptr & 0xffffffffffffff00);
            if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
              pvVar18 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar5 = (model_outputs->trees).
                       super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              sStack_c8 = ((long)pvVar5 - (long)pvVar18 >> 3) * -0x5555555555555555;
              Xc_indptr = (size_t *)(sStack_c8 + (sStack_c8 == 0));
              lVar13 = 0;
              do {
                if (pvVar5 == pvVar18) {
                  dVar29 = 0.0;
                }
                else {
                  dVar29 = 0.0;
                  pdVar23 = (double *)0x0;
                  do {
                    psVar15 = tree_num + (long)pdVar23 * nrows;
                    if (tree_num == (size_t *)0x0) {
                      psVar15 = (size_t *)0x0;
                    }
                    pdVar9 = per_tree_depths + (long)(sStack_c8 * lVar13 + (long)pdVar23);
                    if (per_tree_depths == (double *)0x0) {
                      pdVar9 = (double *)0x0;
                    }
                    pIVar6 = pvVar18[(long)pdVar23].
                             super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    pIVar17 = pIVar6;
                    if (pIVar6->tree_left == 0) {
                      sVar7 = 0;
                    }
                    else {
                      psVar14 = &pIVar6->tree_left;
                      do {
                        psVar16 = &pIVar17->tree_right;
                        if (numeric_data[lVar13 * ncols_numeric + pIVar17->col_num] <=
                            pIVar17->num_split) {
                          psVar16 = psVar14;
                        }
                        sVar7 = *psVar16;
                        pIVar17 = pIVar6 + sVar7;
                        psVar14 = &pIVar6[sVar7].tree_left;
                      } while (*psVar14 != 0);
                    }
                    dVar1 = pIVar17->score;
                    if (psVar15 != (size_t *)0x0) {
                      psVar15[lVar13] = sVar7;
                    }
                    if (pdVar9 != (double *)0x0) {
                      *pdVar9 = dVar1;
                    }
                    dVar29 = dVar29 + dVar1;
                    pdVar23 = (double *)((long)pdVar23 + 1);
                  } while (pdVar23 != (double *)Xc_indptr);
                }
                output_depths[lVar13] = dVar29;
                lVar13 = lVar13 + 1;
              } while (lVar13 != nrows + (nrows == 0));
            }
            else {
              pdStack_f0 = (double *)(nrows + (nrows == 0));
              pdStack_e8 = (double *)(nrows * 8);
              lVar13 = 0;
              pdVar23 = (double *)0x0;
              do {
                dStack_f8 = 0.0;
                pvVar18 = (model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar24 = (long)(model_outputs->trees).
                               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18;
                if (lVar24 != 0) {
                  uVar8 = (lVar24 >> 3) * -0x5555555555555555;
                  lVar24 = 0;
                  uVar22 = 0;
                  pdVar9 = per_tree_depths;
                  pdVar25 = (double *)tree_num;
                  do {
                    Xc_indptr = (size_t *)pdVar25;
                    if (tree_num == (size_t *)0x0) {
                      Xc_indptr = tree_num;
                    }
                    tree_depth = (double *)(uVar8 * lVar13 + (long)pdVar9);
                    if (per_tree_depths == (double *)0x0) {
                      tree_depth = (double *)0x0;
                    }
                    traverse_itree_no_recurse<PredictionData<double,unsigned_long>,unsigned_long>
                              ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                               ((long)&(pvVar18->
                                       super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                       _M_impl + lVar24),model_outputs,&PStack_90,&dStack_f8,
                               Xc_indptr,tree_depth,(size_t)pdVar23);
                    uVar22 = uVar22 + 1;
                    pvVar18 = (model_outputs->trees).
                              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar8 = ((long)(model_outputs->trees).
                                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18 >> 3)
                            * -0x5555555555555555;
                    pdVar25 = (double *)((long)pdVar25 + (long)pdStack_e8);
                    pdVar9 = pdVar9 + 1;
                    lVar24 = lVar24 + 0x18;
                  } while (uVar22 < uVar8);
                }
                output_depths[(long)pdVar23] = dStack_f8;
                pdVar23 = (double *)((long)pdVar23 + 1);
                lVar13 = lVar13 + 8;
              } while (pdVar23 != pdStack_f0);
            }
            goto LAB_001473ca;
          }
        }
      }
    }
    sVar7 = nrows + (nrows == 0);
    lStack_d0 = 0;
    sStack_c8 = nrows * 8;
    pdStack_f0 = (double *)0x0;
    uVar8 = 0;
    row = 0;
    sStack_a8 = sVar7;
    do {
      if ((uVar8 & 1) == 0) {
        pvVar18 = (model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)(model_outputs->trees).
                       super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18;
        uStack_98 = uVar8;
        if (lVar13 == 0) {
          dVar29 = 0.0;
        }
        else {
          uVar8 = (lVar13 >> 3) * -0x5555555555555555;
          dVar29 = 0.0;
          lVar13 = 0;
          uVar22 = 0;
          psVar15 = tree_num;
          pdVar23 = per_tree_depths;
          do {
            puVar12 = psVar15;
            if (tree_num == (size_t *)0x0) {
              puVar12 = tree_num;
            }
            pdVar9 = (double *)(uVar8 * (long)pdStack_f0 + (long)pdVar23);
            if (per_tree_depths == (double *)0x0) {
              pdVar9 = (double *)0x0;
            }
            Xc_indptr = (size_t *)0x0;
            pdStack_e8 = (double *)dVar29;
            dVar29 = traverse_itree<PredictionData<double,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                               ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                ((long)&(pvVar18->
                                        super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                        _M_impl + lVar13),model_outputs,&PStack_90,
                                (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                (ImputedData<unsigned_long,_double> *)0x0,0.0,row,puVar12,pdVar9,0);
            dVar29 = (double)pdStack_e8 + dVar29;
            uVar22 = uVar22 + 1;
            pvVar18 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = ((long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18 >> 3) *
                    -0x5555555555555555;
            psVar15 = (size_t *)((long)psVar15 + sStack_c8);
            pdVar23 = pdVar23 + 1;
            lVar13 = lVar13 + 0x18;
          } while (uVar22 < uVar8);
        }
        output_depths[row] = dVar29;
        sVar7 = sStack_a8;
        uVar8 = uStack_98;
      }
      row = row + 1;
      pdStack_f0 = pdStack_f0 + 1;
    } while (row != sVar7);
    if ((uVar8 & 1) != 0) {
      alStack_c0[0] = lStack_d0;
      if (lStack_d0 != 0) {
        std::__exception_ptr::exception_ptr::_M_addref();
      }
      uVar11 = std::rethrow_exception((exception_ptr)alStack_c0);
      if (lStack_d0 != 0) {
        std::__exception_ptr::exception_ptr::_M_release();
      }
      _Unwind_Resume(uVar11);
    }
    if (lStack_d0 != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
LAB_001473ca:
  pEVar10 = (ExtIsoForest *)model_outputs;
  if (model_outputs == (IsoForest *)0x0) {
    pEVar10 = model_outputs_ext;
  }
  lVar13 = ((long)(pEVar10->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pEVar10->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar26 = true, model_outputs->scoring_metric != Density)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar26 = false;
    }
    else {
      bVar26 = model_outputs_ext->scoring_metric == Density;
    }
  }
  auVar30._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar30._0_8_ = lVar13;
  auVar30._12_4_ = 0x45300000;
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar27 = true, model_outputs->scoring_metric != BoxedRatio)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar27 = false;
    }
    else {
      bVar27 = model_outputs_ext->scoring_metric == BoxedRatio;
    }
  }
  dStack_e0 = auVar30._8_8_ - 1.9342813113834067e+25;
  if (model_outputs != (IsoForest *)0x0) {
    Xc_indptr = (size_t *)CONCAT71((int7)((ulong)Xc_indptr >> 8),1);
    uVar20 = SUB84(Xc_indptr,0);
    if (model_outputs->scoring_metric == BoxedDensity) goto LAB_0014747e;
  }
  if (model_outputs_ext == (ExtIsoForest *)0x0) {
    uVar20 = 0;
  }
  else {
    uVar20 = (undefined4)
             CONCAT71((int7)((ulong)Xc_indptr >> 8),
                      model_outputs_ext->scoring_metric == BoxedDensity);
  }
LAB_0014747e:
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar28 = true, model_outputs->scoring_metric != BoxedDensity2)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar28 = false;
    }
    else {
      bVar28 = model_outputs_ext->scoring_metric == BoxedDensity2;
    }
  }
  pdStack_e8 = (double *)
               (dStack_e0 + ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
  pdStack_f0 = (double *)CONCAT44(pdStack_f0._4_4_,uVar20);
  if (standardize) {
    if (bVar26 || bVar28) {
      lVar13 = 0;
      do {
        output_depths[lVar13] = output_depths[lVar13] / -(double)pdStack_e8;
        lVar13 = lVar13 + 1;
      } while (nrows + (nrows == 0) != lVar13);
    }
    else {
      lVar13 = nrows + (nrows == 0);
      if ((char)uVar20 == '\0') {
        if (bVar27) {
          lVar24 = 0;
          do {
            output_depths[lVar24] = output_depths[lVar24] / (double)pdStack_e8;
            lVar24 = lVar24 + 1;
          } while (lVar13 != lVar24);
        }
        else {
          pdStack_e8 = (double *)((double)pdStack_e8 * pEVar10->exp_avg_depth);
          lVar24 = 0;
          do {
            dVar29 = exp2(-output_depths[lVar24] / (double)pdStack_e8);
            output_depths[lVar24] = dVar29;
            lVar24 = lVar24 + 1;
          } while (lVar13 != lVar24);
        }
      }
      else {
        lVar24 = 0;
        do {
          dVar29 = exp(output_depths[lVar24] / (double)pdStack_e8);
          output_depths[lVar24] = -dVar29;
          lVar24 = lVar24 + 1;
        } while (lVar13 != lVar24);
      }
    }
  }
  else if ((bVar26 || (char)uVar20 != '\0') || bVar28) {
    lVar13 = 0;
    do {
      dVar29 = exp(output_depths[lVar13] / (double)pdStack_e8);
      output_depths[lVar13] = dVar29;
      lVar13 = lVar13 + 1;
    } while (nrows + (nrows == 0) != lVar13);
  }
  else if (bVar27) {
    lVar13 = 0;
    do {
      output_depths[lVar13] = output_depths[lVar13] / -(double)pdStack_e8;
      lVar13 = lVar13 + 1;
    } while (nrows + (nrows == 0) != lVar13);
  }
  else {
    lVar13 = 0;
    do {
      output_depths[lVar13] = output_depths[lVar13] / (double)pdStack_e8;
      lVar13 = lVar13 + 1;
    } while (nrows + (nrows == 0) != lVar13);
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar26 || ((ulong)pdStack_f0 & 1) != 0) || bVar28)) {
    pEVar10 = (ExtIsoForest *)model_outputs;
    if (model_outputs == (IsoForest *)0x0) {
      pEVar10 = model_outputs_ext;
    }
    lVar13 = nrows * -0x5555555555555555 *
             ((long)(pEVar10->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar10->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    if (lVar13 != 0) {
      lVar24 = 0;
      do {
        dVar29 = exp(per_tree_depths[lVar24]);
        per_tree_depths[lVar24] = dVar29;
        lVar24 = lVar24 + 1;
      } while (lVar13 - lVar24 != 0);
    }
  }
  if (tree_num != (size_t *)0x0) {
    if ((indexer != (TreesIndexer *)0x0) &&
       (pSVar2 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pSVar2 != (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      pEVar10 = (ExtIsoForest *)model_outputs;
      if (model_outputs == (IsoForest *)0x0) {
        pEVar10 = model_outputs_ext;
      }
      pvVar19 = (pEVar10->hplanes).
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (pEVar10->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((model_outputs == (IsoForest *)0x0) ||
         ((model_outputs->missing_action != Divide &&
          (((model_outputs->new_cat_action != Weighted || (piStack_a0 == (int *)0x0)) ||
           (model_outputs->cat_split_type != SubSet)))))) {
        if (pvVar3 == pvVar19) {
          return;
        }
        lVar24 = ((long)pvVar3 - (long)pvVar19 >> 3) * -0x5555555555555555;
        lVar13 = 0;
        do {
          puVar4 = pSVar2[lVar13].terminal_node_mappings.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar21 = 0;
          do {
            tree_num[lVar21] = puVar4[tree_num[lVar21]];
            lVar21 = lVar21 + 1;
          } while (nrows + (nrows == 0) != lVar21);
          lVar13 = lVar13 + 1;
          tree_num = tree_num + nrows;
        } while (lVar13 != lVar24 + (ulong)(lVar24 == 0));
        return;
      }
    }
    remap_terminal_trees<PredictionData<double,unsigned_long>,unsigned_long>
              (model_outputs,model_outputs_ext,&PStack_90,tree_num,iStack_ac);
  }
  return;
}

Assistant:

ISOTREE_EXPORTED void predict_iforest(real_t numeric_data[], int categ_data[],
                     bool is_col_major, size_t ncols_numeric, size_t ncols_categ,
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double output_depths[],   sparse_ix tree_num[],
                     double per_tree_depths[],
                     TreesIndexer *indexer)
{
    predict_iforest<real_t, sparse_ix>
                    (numeric_data, categ_data,
                     is_col_major, ncols_numeric, ncols_categ,
                     Xc, Xc_ind, Xc_indptr,
                     Xr, Xr_ind, Xr_indptr,
                     nrows, nthreads, standardize,
                     model_outputs, model_outputs_ext,
                     output_depths,   tree_num,
                     per_tree_depths,
                     indexer);
}